

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O0

bool __thiscall xmrig::Pool::isEnabled(Pool *this)

{
  bool bVar1;
  size_t in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  bool bVar2;
  
  bVar1 = std::bitset<2UL>::test
                    ((bitset<2UL> *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
                     in_RDI);
  bVar2 = false;
  if (bVar1) {
    bVar2 = isValid((Pool *)0x1cfb97);
  }
  return bVar2;
}

Assistant:

bool xmrig::Pool::isEnabled() const
{
#   ifndef XMRIG_FEATURE_TLS
    if (isTLS()) {
        return false;
    }
#   endif

#   ifndef XMRIG_FEATURE_HTTP
    if (m_mode == MODE_DAEMON) {
        return false;
    }
#   endif

#   ifndef XMRIG_FEATURE_HTTP
    if (m_mode == MODE_SELF_SELECT) {
        return false;
    }
#   endif

    return m_flags.test(FLAG_ENABLED) && isValid();
}